

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

size_t ma_dr_wav__write_or_count_metadata
                 (ma_dr_wav *pWav,ma_dr_wav_metadata *pMetadatas,ma_uint32 metadataCount)

{
  size_t sVar1;
  uint *puVar2;
  int *piVar3;
  uint in_EDX;
  long in_RSI;
  char *pID_1;
  ma_uint32 subchunkSize_1;
  ma_dr_wav_metadata *pMetadata_4;
  ma_dr_wav_metadata *pMetadata_3;
  ma_uint32 chunkSize_2;
  char *pID;
  ma_uint32 subchunkSize;
  ma_dr_wav_metadata *pMetadata_2;
  ma_dr_wav_metadata *pMetadata_1;
  ma_uint32 chunkSize_1;
  ma_uint32 timeReferenceHigh;
  ma_uint32 timeReferenceLow;
  char reservedBuf [180];
  ma_uint32 iCuePoint;
  ma_uint32 iLoop;
  ma_uint32 chunkSize;
  ma_dr_wav_metadata *pMetadata;
  ma_uint32 iMetadata;
  ma_bool32 hasListInfo;
  ma_bool32 hasListAdtl;
  size_t bytesWritten;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  int iVar4;
  int in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  ma_dr_wav *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  uint uVar5;
  int iVar6;
  uint local_13c;
  uint local_12c;
  uint local_114;
  undefined1 local_108 [188];
  uint local_4c;
  uint local_48;
  uint local_44;
  uint *local_40;
  uint local_34;
  int local_30;
  int local_2c;
  size_t local_28;
  uint local_1c;
  long local_18;
  size_t local_8;
  
  local_28 = 0;
  local_2c = 0;
  local_30 = 0;
  if ((in_RSI == 0) || (in_EDX == 0)) {
    local_8 = 0;
  }
  else {
    local_1c = in_EDX;
    local_18 = in_RSI;
    for (local_34 = 0; local_34 < local_1c; local_34 = local_34 + 1) {
      local_40 = (uint *)(local_18 + (ulong)local_34 * 0x70);
      local_44 = 0;
      if (((*local_40 & 0x3fe00) != 0) || ((*local_40 == 1 && (local_40[3] == 2)))) {
        local_30 = 1;
      }
      if (((*local_40 & 0x1c0) != 0) || ((*local_40 == 1 && (local_40[3] == 3)))) {
        local_2c = 1;
      }
      in_stack_fffffffffffffe98 = (ma_dr_wav *)(ulong)(*local_40 - 1);
      switch(in_stack_fffffffffffffe98) {
      case (ma_dr_wav *)0x0:
        if (local_40[3] == 1) {
          local_44 = local_40[4];
          sVar1 = ma_dr_wav__write_or_count
                            (in_stack_fffffffffffffe98,
                             (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count
                            (in_stack_fffffffffffffe98,
                             (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          local_28 = sVar1 + local_28;
        }
        break;
      case (ma_dr_wav *)0x1:
        local_44 = local_40[9] * 0x18 + 0x24 + local_40[10];
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        for (local_48 = 0; local_48 < local_40[9]; local_48 = local_48 + 1) {
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
        }
        if (local_40[10] != 0) {
          sVar1 = ma_dr_wav__write_or_count
                            (in_stack_fffffffffffffe98,
                             (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          local_28 = sVar1 + local_28;
        }
        break;
      default:
        break;
      case (ma_dr_wav *)0x3:
        local_44 = 7;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        break;
      case (ma_dr_wav *)0x7:
        local_44 = local_40[2] * 0x18 + 4;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        for (local_4c = 0; local_4c < local_40[2]; local_4c = local_4c + 1) {
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count
                            (in_stack_fffffffffffffe98,
                             (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
        }
        break;
      case (ma_dr_wav *)0xf:
        local_44 = 0x18;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_f32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0.0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_f32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0.0);
        local_28 = sVar1 + local_28;
        break;
      case (ma_dr_wav *)0x1f:
        local_44 = local_40[0x14] + 0x25a;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_string_to_fixed_size_buf
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_string_to_fixed_size_buf
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_string_to_fixed_size_buf
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
        local_28 = sVar1 + local_28;
        memset(local_108,0,0xb4);
        sVar1 = ma_dr_wav__write_or_count
                          (in_stack_fffffffffffffe98,
                           (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_28 = sVar1 + local_28;
        if (local_40[0x14] != 0) {
          sVar1 = ma_dr_wav__write_or_count
                            (in_stack_fffffffffffffe98,
                             (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          local_28 = sVar1 + local_28;
        }
      }
      if ((local_44 & 1) != 0) {
        sVar1 = ma_dr_wav__write_or_count_byte
                          ((ma_dr_wav *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),'\0');
        local_28 = sVar1 + local_28;
      }
    }
    if (local_30 != 0) {
      local_114 = 0;
      for (local_34 = 0; local_34 < local_1c; local_34 = local_34 + 1) {
        puVar2 = (uint *)(local_18 + (ulong)local_34 * 0x70);
        if ((*puVar2 & 0x3fe00) == 0) {
          if ((*puVar2 == 1) && (puVar2[3] == 2)) {
            local_114 = puVar2[4] + local_114 + 8;
          }
        }
        else {
          local_114 = puVar2[2] + local_114 + 9;
        }
        if ((local_114 & 1) != 0) {
          local_114 = local_114 + 1;
        }
      }
      sVar1 = ma_dr_wav__write_or_count
                        (in_stack_fffffffffffffe98,
                         (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      local_28 = sVar1 + local_28;
      sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                        ((ma_dr_wav *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                         0);
      local_28 = sVar1 + local_28;
      sVar1 = ma_dr_wav__write_or_count
                        (in_stack_fffffffffffffe98,
                         (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      local_28 = sVar1 + local_28;
      for (local_34 = 0; local_34 < local_1c; local_34 = local_34 + 1) {
        puVar2 = (uint *)(local_18 + (ulong)local_34 * 0x70);
        local_12c = 0;
        if ((*puVar2 & 0x3fe00) == 0) {
          if (((*puVar2 == 1) && (puVar2[3] == 2)) && (puVar2[4] != 0)) {
            local_12c = puVar2[4];
            sVar1 = ma_dr_wav__write_or_count
                              (in_stack_fffffffffffffe98,
                               (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                               ,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            local_28 = sVar1 + local_28;
            sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                              ((ma_dr_wav *)
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
            local_28 = sVar1 + local_28;
            sVar1 = ma_dr_wav__write_or_count
                              (in_stack_fffffffffffffe98,
                               (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                               ,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            local_28 = sVar1 + local_28;
          }
        }
        else {
          in_stack_fffffffffffffe94 = *puVar2;
          if (puVar2[2] != 0) {
            local_12c = puVar2[2] + 1;
            sVar1 = ma_dr_wav__write_or_count
                              (in_stack_fffffffffffffe98,
                               (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                               ,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            local_28 = sVar1 + local_28;
            sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                              ((ma_dr_wav *)
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
            local_28 = sVar1 + local_28;
            sVar1 = ma_dr_wav__write_or_count
                              (in_stack_fffffffffffffe98,
                               (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                               ,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            local_28 = sVar1 + local_28;
            sVar1 = ma_dr_wav__write_or_count_byte
                              ((ma_dr_wav *)
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),'\0');
            local_28 = sVar1 + local_28;
          }
        }
        if ((local_12c & 1) != 0) {
          sVar1 = ma_dr_wav__write_or_count_byte
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),'\0');
          local_28 = sVar1 + local_28;
        }
      }
    }
    if (local_2c != 0) {
      local_13c = 0;
      for (local_34 = 0; local_34 < local_1c; local_34 = local_34 + 1) {
        piVar3 = (int *)(local_18 + (ulong)local_34 * 0x70);
        in_stack_fffffffffffffe90 = *piVar3;
        if (in_stack_fffffffffffffe90 == 1) {
          if (piVar3[3] == 3) {
            local_13c = piVar3[4] + local_13c + 8;
          }
        }
        else if ((in_stack_fffffffffffffe90 == 0x40) || (in_stack_fffffffffffffe90 == 0x80)) {
          local_13c = local_13c + 0xc;
          if (piVar3[3] != 0) {
            local_13c = piVar3[3] + 1 + local_13c;
          }
        }
        else if ((in_stack_fffffffffffffe90 == 0x100) &&
                (local_13c = local_13c + 0x1c, piVar3[7] != 0)) {
          local_13c = piVar3[7] + 1 + local_13c;
        }
        if ((local_13c & 1) != 0) {
          local_13c = local_13c + 1;
        }
      }
      sVar1 = ma_dr_wav__write_or_count
                        (in_stack_fffffffffffffe98,
                         (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      local_28 = sVar1 + local_28;
      sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                        ((ma_dr_wav *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                         0);
      local_28 = sVar1 + local_28;
      sVar1 = ma_dr_wav__write_or_count
                        (in_stack_fffffffffffffe98,
                         (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      local_28 = sVar1 + local_28;
      for (local_34 = 0; local_34 < local_1c; local_34 = local_34 + 1) {
        piVar3 = (int *)(local_18 + (ulong)local_34 * 0x70);
        uVar5 = 0;
        iVar4 = *piVar3;
        if (iVar4 == 1) {
          if (piVar3[3] == 3) {
            uVar5 = piVar3[4];
            sVar1 = ma_dr_wav__write_or_count
                              (in_stack_fffffffffffffe98,
                               (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                               ,CONCAT44(1,in_stack_fffffffffffffe88));
            local_28 = sVar1 + local_28;
            sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                              ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),0);
            local_28 = sVar1 + local_28;
            sVar1 = ma_dr_wav__write_or_count
                              (in_stack_fffffffffffffe98,
                               (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                               ,CONCAT44(iVar4,in_stack_fffffffffffffe88));
            local_28 = sVar1 + local_28;
          }
        }
        else if ((iVar4 == 0x40) || (iVar4 == 0x80)) {
          if (piVar3[3] != 0) {
            iVar6 = 0;
            sVar1 = ma_dr_wav__write_or_count
                              (in_stack_fffffffffffffe98,
                               (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                               ,CONCAT44(iVar4,in_stack_fffffffffffffe88));
            local_28 = sVar1 + local_28;
            uVar5 = piVar3[3] + 1 + iVar6;
            sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                              ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),0);
            local_28 = sVar1 + local_28;
            sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                              ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),0);
            local_28 = sVar1 + local_28;
            sVar1 = ma_dr_wav__write_or_count
                              (in_stack_fffffffffffffe98,
                               (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                               ,CONCAT44(iVar4,in_stack_fffffffffffffe88));
            local_28 = sVar1 + local_28;
            sVar1 = ma_dr_wav__write_or_count_byte
                              ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),'\0');
            local_28 = sVar1 + local_28;
          }
        }
        else if (iVar4 == 0x100) {
          uVar5 = 0;
          sVar1 = ma_dr_wav__write_or_count
                            (in_stack_fffffffffffffe98,
                             (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             CONCAT44(0x100,in_stack_fffffffffffffe88));
          local_28 = sVar1 + local_28;
          if (piVar3[7] != 0) {
            uVar5 = piVar3[7] + 1 + uVar5;
          }
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u32ne_to_le
                            ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count
                            (in_stack_fffffffffffffe98,
                             (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             CONCAT44(iVar4,in_stack_fffffffffffffe88));
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                            ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                            ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                            ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          sVar1 = ma_dr_wav__write_or_count_u16ne_to_le
                            ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),0);
          local_28 = sVar1 + local_28;
          if (piVar3[7] != 0) {
            sVar1 = ma_dr_wav__write_or_count
                              (in_stack_fffffffffffffe98,
                               (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                               ,CONCAT44(iVar4,in_stack_fffffffffffffe88));
            local_28 = sVar1 + local_28;
            sVar1 = ma_dr_wav__write_or_count_byte
                              ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),'\0');
            local_28 = sVar1 + local_28;
          }
        }
        if ((uVar5 & 1) != 0) {
          sVar1 = ma_dr_wav__write_or_count_byte
                            ((ma_dr_wav *)CONCAT44(iVar4,in_stack_fffffffffffffe88),'\0');
          local_28 = sVar1 + local_28;
        }
      }
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

MA_PRIVATE size_t ma_dr_wav__write_or_count_metadata(ma_dr_wav* pWav, ma_dr_wav_metadata* pMetadatas, ma_uint32 metadataCount)
{
    size_t bytesWritten = 0;
    ma_bool32 hasListAdtl = MA_FALSE;
    ma_bool32 hasListInfo = MA_FALSE;
    ma_uint32 iMetadata;
    if (pMetadatas == NULL || metadataCount == 0) {
        return 0;
    }
    for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
        ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
        ma_uint32 chunkSize = 0;
        if ((pMetadata->type & ma_dr_wav_metadata_type_list_all_info_strings) || (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_info_list)) {
            hasListInfo = MA_TRUE;
        }
        if ((pMetadata->type & ma_dr_wav_metadata_type_list_all_adtl) || (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_adtl_list)) {
            hasListAdtl = MA_TRUE;
        }
        switch (pMetadata->type) {
            case ma_dr_wav_metadata_type_smpl:
            {
                ma_uint32 iLoop;
                chunkSize = MA_DR_WAV_SMPL_BYTES + MA_DR_WAV_SMPL_LOOP_BYTES * pMetadata->data.smpl.sampleLoopCount + pMetadata->data.smpl.samplerSpecificDataSizeInBytes;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "smpl", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.manufacturerId);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.productId);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.samplePeriodNanoseconds);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.midiUnityNote);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.midiPitchFraction);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.smpteFormat);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.smpteOffset);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.sampleLoopCount);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.samplerSpecificDataSizeInBytes);
                for (iLoop = 0; iLoop < pMetadata->data.smpl.sampleLoopCount; ++iLoop) {
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].cuePointId);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].type);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].firstSampleByteOffset);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].lastSampleByteOffset);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].sampleFraction);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].playCount);
                }
                if (pMetadata->data.smpl.samplerSpecificDataSizeInBytes > 0) {
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.smpl.pSamplerSpecificData, pMetadata->data.smpl.samplerSpecificDataSizeInBytes);
                }
            } break;
            case ma_dr_wav_metadata_type_inst:
            {
                chunkSize = MA_DR_WAV_INST_BYTES;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "inst", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.midiUnityNote, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.fineTuneCents, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.gainDecibels, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.lowNote, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.highNote, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.lowVelocity, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.highVelocity, 1);
            } break;
            case ma_dr_wav_metadata_type_cue:
            {
                ma_uint32 iCuePoint;
                chunkSize = MA_DR_WAV_CUE_BYTES + MA_DR_WAV_CUE_POINT_BYTES * pMetadata->data.cue.cuePointCount;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "cue ", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.cuePointCount);
                for (iCuePoint = 0; iCuePoint < pMetadata->data.cue.cuePointCount; ++iCuePoint) {
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].id);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].playOrderPosition);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].dataChunkId, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].chunkStart);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].blockStart);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].sampleByteOffset);
                }
            } break;
            case ma_dr_wav_metadata_type_acid:
            {
                chunkSize = MA_DR_WAV_ACID_BYTES;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "acid", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.acid.flags);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.midiUnityNote);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.reserved1);
                bytesWritten += ma_dr_wav__write_or_count_f32ne_to_le(pWav, pMetadata->data.acid.reserved2);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.acid.numBeats);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.meterDenominator);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.meterNumerator);
                bytesWritten += ma_dr_wav__write_or_count_f32ne_to_le(pWav, pMetadata->data.acid.tempo);
            } break;
            case ma_dr_wav_metadata_type_bext:
            {
                char reservedBuf[MA_DR_WAV_BEXT_RESERVED_BYTES];
                ma_uint32 timeReferenceLow;
                ma_uint32 timeReferenceHigh;
                chunkSize = MA_DR_WAV_BEXT_BYTES + pMetadata->data.bext.codingHistorySize;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "bext", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_string_to_fixed_size_buf(pWav, pMetadata->data.bext.pDescription, MA_DR_WAV_BEXT_DESCRIPTION_BYTES);
                bytesWritten += ma_dr_wav__write_or_count_string_to_fixed_size_buf(pWav, pMetadata->data.bext.pOriginatorName, MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES);
                bytesWritten += ma_dr_wav__write_or_count_string_to_fixed_size_buf(pWav, pMetadata->data.bext.pOriginatorReference, MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES);
                bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pOriginationDate, sizeof(pMetadata->data.bext.pOriginationDate));
                bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pOriginationTime, sizeof(pMetadata->data.bext.pOriginationTime));
                timeReferenceLow  = (ma_uint32)(pMetadata->data.bext.timeReference & 0xFFFFFFFF);
                timeReferenceHigh = (ma_uint32)(pMetadata->data.bext.timeReference >> 32);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, timeReferenceLow);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, timeReferenceHigh);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.version);
                bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pUMID, MA_DR_WAV_BEXT_UMID_BYTES);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.loudnessValue);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.loudnessRange);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.maxTruePeakLevel);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.maxMomentaryLoudness);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.maxShortTermLoudness);
                MA_DR_WAV_ZERO_MEMORY(reservedBuf, sizeof(reservedBuf));
                bytesWritten += ma_dr_wav__write_or_count(pWav, reservedBuf, sizeof(reservedBuf));
                if (pMetadata->data.bext.codingHistorySize > 0) {
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pCodingHistory, pMetadata->data.bext.codingHistorySize);
                }
            } break;
            case ma_dr_wav_metadata_type_unknown:
            {
                if (pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_top_level) {
                    chunkSize = pMetadata->data.unknown.dataSizeInBytes;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.id, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.pData, pMetadata->data.unknown.dataSizeInBytes);
                }
            } break;
            default: break;
        }
        if ((chunkSize % 2) != 0) {
            bytesWritten += ma_dr_wav__write_or_count_byte(pWav, 0);
        }
    }
    if (hasListInfo) {
        ma_uint32 chunkSize = 4;
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            if ((pMetadata->type & ma_dr_wav_metadata_type_list_all_info_strings)) {
                chunkSize += 8;
                chunkSize += pMetadata->data.infoText.stringLength + 1;
            } else if (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_info_list) {
                chunkSize += 8;
                chunkSize += pMetadata->data.unknown.dataSizeInBytes;
            }
            if ((chunkSize % 2) != 0) {
                chunkSize += 1;
            }
        }
        bytesWritten += ma_dr_wav__write_or_count(pWav, "LIST", 4);
        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
        bytesWritten += ma_dr_wav__write_or_count(pWav, "INFO", 4);
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            ma_uint32 subchunkSize = 0;
            if (pMetadata->type & ma_dr_wav_metadata_type_list_all_info_strings) {
                const char* pID = NULL;
                switch (pMetadata->type) {
                    case ma_dr_wav_metadata_type_list_info_software:    pID = "ISFT"; break;
                    case ma_dr_wav_metadata_type_list_info_copyright:   pID = "ICOP"; break;
                    case ma_dr_wav_metadata_type_list_info_title:       pID = "INAM"; break;
                    case ma_dr_wav_metadata_type_list_info_artist:      pID = "IART"; break;
                    case ma_dr_wav_metadata_type_list_info_comment:     pID = "ICMT"; break;
                    case ma_dr_wav_metadata_type_list_info_date:        pID = "ICRD"; break;
                    case ma_dr_wav_metadata_type_list_info_genre:       pID = "IGNR"; break;
                    case ma_dr_wav_metadata_type_list_info_album:       pID = "IPRD"; break;
                    case ma_dr_wav_metadata_type_list_info_tracknumber: pID = "ITRK"; break;
                    default: break;
                }
                MA_DR_WAV_ASSERT(pID != NULL);
                if (pMetadata->data.infoText.stringLength) {
                    subchunkSize = pMetadata->data.infoText.stringLength + 1;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pID, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.infoText.pString, pMetadata->data.infoText.stringLength);
                    bytesWritten += ma_dr_wav__write_or_count_byte(pWav, '\0');
                }
            } else if (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_info_list) {
                if (pMetadata->data.unknown.dataSizeInBytes) {
                    subchunkSize = pMetadata->data.unknown.dataSizeInBytes;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.id, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.unknown.dataSizeInBytes);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.pData, subchunkSize);
                }
            }
            if ((subchunkSize % 2) != 0) {
                bytesWritten += ma_dr_wav__write_or_count_byte(pWav, 0);
            }
        }
    }
    if (hasListAdtl) {
        ma_uint32 chunkSize = 4;
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            switch (pMetadata->type)
            {
                case ma_dr_wav_metadata_type_list_label:
                case ma_dr_wav_metadata_type_list_note:
                {
                    chunkSize += 8;
                    chunkSize += MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
                    if (pMetadata->data.labelOrNote.stringLength > 0) {
                        chunkSize += pMetadata->data.labelOrNote.stringLength + 1;
                    }
                } break;
                case ma_dr_wav_metadata_type_list_labelled_cue_region:
                {
                    chunkSize += 8;
                    chunkSize += MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
                    if (pMetadata->data.labelledCueRegion.stringLength > 0) {
                        chunkSize += pMetadata->data.labelledCueRegion.stringLength + 1;
                    }
                } break;
                case ma_dr_wav_metadata_type_unknown:
                {
                    if (pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_adtl_list) {
                        chunkSize += 8;
                        chunkSize += pMetadata->data.unknown.dataSizeInBytes;
                    }
                } break;
                default: break;
            }
            if ((chunkSize % 2) != 0) {
                chunkSize += 1;
            }
        }
        bytesWritten += ma_dr_wav__write_or_count(pWav, "LIST", 4);
        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
        bytesWritten += ma_dr_wav__write_or_count(pWav, "adtl", 4);
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            ma_uint32 subchunkSize = 0;
            switch (pMetadata->type)
            {
                case ma_dr_wav_metadata_type_list_label:
                case ma_dr_wav_metadata_type_list_note:
                {
                    if (pMetadata->data.labelOrNote.stringLength > 0) {
                        const char *pID = NULL;
                        if (pMetadata->type == ma_dr_wav_metadata_type_list_label) {
                            pID = "labl";
                        }
                        else if (pMetadata->type == ma_dr_wav_metadata_type_list_note) {
                            pID = "note";
                        }
                        MA_DR_WAV_ASSERT(pID != NULL);
                        MA_DR_WAV_ASSERT(pMetadata->data.labelOrNote.pString != NULL);
                        subchunkSize = MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pID, 4);
                        subchunkSize += pMetadata->data.labelOrNote.stringLength + 1;
                        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.labelOrNote.cuePointId);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.labelOrNote.pString, pMetadata->data.labelOrNote.stringLength);
                        bytesWritten += ma_dr_wav__write_or_count_byte(pWav, '\0');
                    }
                } break;
                case ma_dr_wav_metadata_type_list_labelled_cue_region:
                {
                    subchunkSize = MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, "ltxt", 4);
                    if (pMetadata->data.labelledCueRegion.stringLength > 0) {
                        subchunkSize += pMetadata->data.labelledCueRegion.stringLength + 1;
                    }
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.labelledCueRegion.cuePointId);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.labelledCueRegion.sampleLength);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.labelledCueRegion.purposeId, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.country);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.language);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.dialect);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.codePage);
                    if (pMetadata->data.labelledCueRegion.stringLength > 0) {
                        MA_DR_WAV_ASSERT(pMetadata->data.labelledCueRegion.pString != NULL);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.labelledCueRegion.pString, pMetadata->data.labelledCueRegion.stringLength);
                        bytesWritten += ma_dr_wav__write_or_count_byte(pWav, '\0');
                    }
                } break;
                case ma_dr_wav_metadata_type_unknown:
                {
                    if (pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_adtl_list) {
                        subchunkSize = pMetadata->data.unknown.dataSizeInBytes;
                        MA_DR_WAV_ASSERT(pMetadata->data.unknown.pData != NULL);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.id, 4);
                        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.pData, subchunkSize);
                    }
                } break;
                default: break;
            }
            if ((subchunkSize % 2) != 0) {
                bytesWritten += ma_dr_wav__write_or_count_byte(pWav, 0);
            }
        }
    }
    MA_DR_WAV_ASSERT((bytesWritten % 2) == 0);
    return bytesWritten;
}